

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dagify.cpp
# Opt level: O0

unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
* handlegraph::algorithms::dagify_from
            (HandleGraph *graph,
            vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *start_handles,
            DeletableHandleGraph *into,size_t min_preserved_path_length)

{
  bool bVar1;
  reference phVar2;
  long *in_RCX;
  anon_class_16_2_6460483b *__f;
  long *in_RSI;
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  *in_RDI;
  pair<std::__detail::_Node_iterator<long_long,_true,_false>,_bool> pVar3;
  handle_t *h_2;
  iterator __end2_3;
  iterator __begin2_3;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2_3;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> to_remove;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  visited_nodes;
  longlong *new_id;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  bool is_rev;
  nid_t id;
  handle_t *h_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2_2;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> into_start_handles;
  pair<const_long_long,_long_long> *kv;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  *__range2_1;
  unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  start_id_to_new_ids;
  handle_t *h;
  iterator __end2;
  iterator __begin2;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  start_nodes;
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  *new_id_to_old_id;
  size_t in_stack_00000388;
  MutableHandleGraph *in_stack_00000390;
  HandleGraph *in_stack_00000398;
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  *in_stack_fffffffffffffcb8;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  *in_stack_fffffffffffffcc0;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  *__lhs;
  value_type *in_stack_fffffffffffffcc8;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  *in_stack_fffffffffffffcd0;
  function<void_(const_handlegraph::handle_t_&)> *this;
  undefined8 in_stack_fffffffffffffd00;
  undefined1 parallel;
  anon_class_32_4_3a029209 *in_stack_fffffffffffffd08;
  HandleGraph *in_stack_fffffffffffffd10;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_290;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *local_288;
  long **local_280;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  *local_278;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *local_270;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_260;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  *sinks;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *pvVar4;
  function<void_(const_handlegraph::handle_t_&)> *in_stack_fffffffffffffdf0;
  function<void_(const_handlegraph::handle_t_&)> *in_stack_fffffffffffffdf8;
  HandleGraph *in_stack_fffffffffffffe00;
  function<void_(const_handlegraph::handle_t_&)> local_1d0;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_1b0 [7];
  undefined8 local_178;
  reference local_170;
  longlong *local_168;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_160;
  mapped_type *local_158;
  byte local_149;
  undefined8 local_148;
  reference local_140;
  handle_t *local_138;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_130 [5];
  reference local_108;
  _Node_iterator_base<std::pair<const_long_long,_long_long>,_false> local_100;
  _Node_iterator_base<std::pair<const_long_long,_long_long>,_false> local_f8 [9];
  _Node_iterator_base<long_long,_false> local_b0;
  undefined1 local_a8;
  undefined8 local_90;
  reference local_88;
  handle_t *local_80;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_78 [9];
  byte local_29;
  long *local_20 [2];
  long *local_10;
  
  local_29 = 0;
  local_20[0] = in_RCX;
  local_10 = in_RSI;
  dagify(in_stack_00000398,in_stack_00000390,in_stack_00000388);
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::unordered_set((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                   *)0x264c0b);
  local_78[0]._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                  in_stack_fffffffffffffcb8);
  local_80 = (handle_t *)
             std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                       ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                        in_stack_fffffffffffffcb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffcc0,
                            (__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffcb8), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
               ::operator*(local_78);
    local_90 = (**(code **)(*local_10 + 0x20))(local_10,local_88);
    pVar3 = std::
            unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
            ::insert(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    local_b0._M_cur = (__node_type *)pVar3.first.super__Node_iterator_base<long_long,_false>._M_cur;
    local_a8 = pVar3.second;
    __gnu_cxx::
    __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(local_78);
  }
  std::
  unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::unordered_map((unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   *)0x264d12);
  local_f8[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
       ::begin(in_stack_fffffffffffffcb8);
  local_100._M_cur =
       (__node_type *)
       std::
       unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
       ::end(in_stack_fffffffffffffcb8);
  while (bVar1 = std::__detail::operator!=(local_f8,&local_100), bVar1) {
    local_108 = std::__detail::_Node_iterator<std::pair<const_long_long,_long_long>,_false,_false>::
                operator*((_Node_iterator<std::pair<const_long_long,_long_long>,_false,_false> *)
                          0x264d77);
    in_stack_fffffffffffffd10 =
         (HandleGraph *)
         std::
         unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
         ::count(in_stack_fffffffffffffcc0,(key_type *)in_stack_fffffffffffffcb8);
    if (in_stack_fffffffffffffd10 != (HandleGraph *)0x0) {
      in_stack_fffffffffffffd08 =
           (anon_class_32_4_3a029209 *)
           std::
           unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
           ::operator[]((unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                         *)in_stack_fffffffffffffcc0,(key_type *)in_stack_fffffffffffffcb8);
      std::vector<long_long,_std::allocator<long_long>_>::push_back
                ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffcd0,
                 in_stack_fffffffffffffcc8);
    }
    std::__detail::_Node_iterator<std::pair<const_long_long,_long_long>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_long_long,_long_long>,_false,_false> *)
               in_stack_fffffffffffffcc0);
  }
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x264e1a);
  local_130[0]._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                  in_stack_fffffffffffffcb8);
  local_138 = (handle_t *)
              std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                        ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                         in_stack_fffffffffffffcb8);
  while( true ) {
    parallel = (undefined1)((ulong)in_stack_fffffffffffffd00 >> 0x38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                        *)in_stack_fffffffffffffcc0,
                       (__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                        *)in_stack_fffffffffffffcb8);
    if (!bVar1) break;
    local_140 = __gnu_cxx::
                __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                ::operator*(local_130);
    in_stack_fffffffffffffd00 = (**(code **)(*local_10 + 0x20))(local_10,local_140);
    local_148 = in_stack_fffffffffffffd00;
    local_149 = (**(code **)(*local_10 + 0x28))(local_10,local_140);
    local_149 = local_149 & 1;
    local_158 = std::
                unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ::operator[]((unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)in_stack_fffffffffffffcc0,(key_type *)in_stack_fffffffffffffcb8);
    local_160._M_current =
         (longlong *)
         std::vector<long_long,_std::allocator<long_long>_>::begin
                   ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffcb8);
    local_168 = (longlong *)
                std::vector<long_long,_std::allocator<long_long>_>::end
                          ((vector<long_long,_std::allocator<long_long>_> *)
                           in_stack_fffffffffffffcb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                               *)in_stack_fffffffffffffcc0,
                              (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                               *)in_stack_fffffffffffffcb8), bVar1) {
      local_170 = __gnu_cxx::
                  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                  ::operator*(&local_160);
      local_178 = (**(code **)(*(long *)((long)local_20[0] + *(long *)(*local_20[0] + -0xb0)) + 0x18
                              ))((long)local_20[0] + *(long *)(*local_20[0] + -0xb0),local_170,
                                 local_149 & 1);
      std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::push_back
                ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                 in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
      __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
      ::operator++(&local_160);
    }
    __gnu_cxx::
    __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(local_130);
  }
  __lhs = local_1b0;
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::unordered_set((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                   *)0x265016);
  __f = (anon_class_16_2_6460483b *)((long)local_20[0] + *(long *)(*local_20[0] + -0xb0));
  this = &local_1d0;
  std::function<void(handlegraph::handle_t_const&)>::
  function<handlegraph::algorithms::dagify_from(handlegraph::HandleGraph_const*,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>,handlegraph::DeletableHandleGraph*,unsigned_long)::__0,void>
            (this,__f);
  std::function<void(handlegraph::handle_t_const&)>::
  function<handlegraph::algorithms::dagify_from(handlegraph::HandleGraph_const*,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>,handlegraph::DeletableHandleGraph*,unsigned_long)::__1,void>
            (this,(anon_class_1_0_00000001 *)__f);
  local_228 = 0;
  sinks = (unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
           *)0x0;
  local_238 = 0;
  uStack_230 = 0;
  local_248 = 0;
  uStack_240 = 0;
  pvVar4 = (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x0;
  std::
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  ::unordered_set((unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                   *)0x2650ba);
  internal::dfs(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,pvVar4
                ,sinks);
  std::
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  ::~unordered_set((unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                    *)0x2650ea);
  std::function<void_(const_handlegraph::handle_t_&)>::~function
            ((function<void_(const_handlegraph::handle_t_&)> *)0x2650f7);
  std::function<void_(const_handlegraph::handle_t_&)>::~function
            ((function<void_(const_handlegraph::handle_t_&)> *)0x265104);
  pvVar4 = &local_260;
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x265115);
  local_280 = local_20;
  local_278 = local_1b0;
  local_270 = pvVar4;
  HandleGraph::
  for_each_handle<handlegraph::algorithms::dagify_from(handlegraph::HandleGraph_const*,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>,handlegraph::DeletableHandleGraph*,unsigned_long)::__2>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,(bool)parallel);
  local_288 = &local_260;
  local_290._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin(pvVar4);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end(pvVar4);
  while (bVar1 = __gnu_cxx::operator!=
                           (__lhs,(__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                                   *)pvVar4), bVar1) {
    phVar2 = __gnu_cxx::
             __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
             ::operator*(&local_290);
    (**(code **)(*local_20[0] + 0xf8))(local_20[0],phVar2);
    __gnu_cxx::
    __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(&local_290);
  }
  local_29 = 1;
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)this);
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::~unordered_set((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                    *)0x265295);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)this);
  std::
  unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~unordered_map((unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    *)0x2652af);
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::~unordered_set((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                    *)0x2652bc);
  if ((local_29 & 1) == 0) {
    std::
    unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
    ::~unordered_map((unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                      *)0x265318);
  }
  return in_RDI;
}

Assistant:

std::unordered_map<nid_t, nid_t> dagify_from(const HandleGraph* graph,
                                             std::vector<handle_t> start_handles,
                                             DeletableHandleGraph* into,
                                             size_t min_preserved_path_length) {
    
    // Cheating implementation
    
    // Dagify the *entire* graph, creating some nodes not reachable from the starting points.
    auto new_id_to_old_id = dagify(graph, into, min_preserved_path_length);
    
    // Find all the node IDs we have start handles on
    std::unordered_set<nid_t> start_nodes;
    for (auto& h : start_handles) {
        start_nodes.insert(graph->get_id(h));
    }
    
    // Invert enough of the ID mapping so we can translate our start handles
    std::unordered_map<nid_t, std::vector<nid_t>> start_id_to_new_ids;
    for (auto& kv : new_id_to_old_id) {
        if (start_nodes.count(kv.second)) {
            start_id_to_new_ids[kv.second].push_back(kv.first);
        }
    }
    
    // Translate all our start handles into the into graph.
    std::vector<handle_t> into_start_handles;
    for (auto& h : start_handles) {
        auto id = graph->get_id(h);
        auto is_rev = graph->get_is_reverse(h);
        for (auto& new_id : start_id_to_new_ids[id]) {
            // We know the orientations of the duplicated nodes are the same, so we just pass orientation along.
            into_start_handles.push_back(into->get_handle(new_id, is_rev));
        }
    }
    
    // Tag all the nodes we can reach on oriented walks from the starting
    // handles' copies.
    std::unordered_set<nid_t> visited_nodes;
    handlegraph::algorithms::internal::dfs(
        *into,
        [&](const handle_t& h) -> void {
            // Called when node orientation is first encountered.
            // Mark the node as reachable.
            visited_nodes.insert(into->get_id(h));
        },
        [](const handle_t& ignored) -> void {},
        into_start_handles,
        {}
    );
    
    // TODO: We're supposed to be able to destroy the current handle as we loop
    // over it, but HashGraph can't handle that.
    std::vector<handle_t> to_remove;
    into->for_each_handle([&](const handle_t& h) {
        auto node_id = into->get_id(h);
        if (!visited_nodes.count(node_id)) {
            // Destroy each handle not visited on such a walk.
            to_remove.push_back(h);
            // And the translation from it
            new_id_to_old_id.erase(node_id);
        }
    });
    for (auto& h : to_remove) {
         into->destroy_handle(h);
    }
    
    return new_id_to_old_id;
}